

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meanfield_cpu.cpp
# Opt level: O1

void __thiscall
MeanField::CPU::CRF::CRF
          (CRF *this,int width,int height,int dimensions,float spatialSD,float bilateralSpatialSD,
          float bilateralIntensitySD,bool separable)

{
  float *pfVar1;
  float *pfVar2;
  float *__s;
  float *__s_00;
  ulong uVar3;
  int iVar4;
  int i;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  
  (this->super_CRF)._vptr_CRF = (_func_int **)&PTR_filterGaussian_001089c0;
  this->width = width;
  this->height = height;
  this->dimensions = dimensions;
  this->spatialSD = spatialSD;
  this->bilateralSpatialSD = bilateralSpatialSD;
  this->bilateralIntensitySD = bilateralIntensitySD;
  this->spatialWeight = 1.0;
  this->bilateralWeight = 1.0;
  this->separable = separable;
  iVar4 = height * width * dimensions;
  uVar3 = 0xffffffffffffffff;
  if (-1 < iVar4) {
    uVar3 = (long)iVar4 * 4;
  }
  pfVar1 = (float *)operator_new__(uVar3);
  memset(pfVar1,0,uVar3);
  (this->QDistribution)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar1;
  pfVar1 = (float *)operator_new__(uVar3);
  memset(pfVar1,0,uVar3);
  (this->QDistributionTmp)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar1;
  uVar7 = (ulong)(uint)(dimensions * dimensions) << 2;
  pfVar1 = (float *)operator_new__(uVar7);
  memset(pfVar1,0,uVar7);
  (this->pottsModel)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar1;
  pfVar2 = (float *)operator_new__(uVar3);
  memset(pfVar2,0,uVar3);
  (this->gaussianOut)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar2;
  pfVar2 = (float *)operator_new__(uVar3);
  memset(pfVar2,0,uVar3);
  (this->bilateralOut)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar2;
  pfVar2 = (float *)operator_new__(uVar3);
  memset(pfVar2,0,uVar3);
  (this->aggregatedFilters)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar2;
  pfVar2 = (float *)operator_new__(uVar3);
  memset(pfVar2,0,uVar3);
  (this->filterOutTmp)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar2;
  pfVar2 = (float *)operator_new__(0x400);
  memset(pfVar2,0,0x400);
  (this->spatialKernel)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar2;
  __s = (float *)operator_new__(0x400);
  memset(__s,0,0x400);
  (this->bilateralSpatialKernel)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
  _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = __s;
  __s_00 = (float *)operator_new__(0x400);
  memset(__s_00,0,0x400);
  (this->bilateralIntensityKernel)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
  _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = __s_00;
  if (0 < dimensions) {
    uVar3 = (ulong)(uint)dimensions;
    uVar7 = 0;
    do {
      uVar6 = 0;
      do {
        fVar8 = -1.0;
        if (uVar7 != uVar6) {
          fVar8 = 0.0;
        }
        pfVar1[uVar6] = fVar8;
        uVar6 = uVar6 + 1;
      } while (uVar3 != uVar6);
      uVar7 = uVar7 + 1;
      pfVar1 = pfVar1 + uVar3;
    } while (uVar7 != uVar3);
  }
  lVar5 = 0;
  do {
    fVar8 = expf((float)-((int)lVar5 * (int)lVar5) / ((spatialSD + spatialSD) * spatialSD));
    pfVar2[lVar5] = fVar8;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x100);
  lVar5 = 0;
  do {
    fVar8 = expf((float)-((int)lVar5 * (int)lVar5) /
                 ((bilateralSpatialSD + bilateralSpatialSD) * bilateralSpatialSD));
    __s[lVar5] = fVar8;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x100);
  lVar5 = 0;
  do {
    fVar8 = expf((float)-((int)lVar5 * (int)lVar5) /
                 ((bilateralIntensitySD + bilateralIntensitySD) * bilateralIntensitySD));
    __s_00[lVar5] = fVar8;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x100);
  return;
}

Assistant:

CRF::CRF(int width, int height, int dimensions, float spatialSD,
    float bilateralSpatialSD, float bilateralIntensitySD, bool separable) :
    width(width), height(height), dimensions(dimensions),
    spatialWeight(1.0), bilateralWeight(1.0),
    spatialSD(spatialSD), bilateralSpatialSD(bilateralSpatialSD),
    bilateralIntensitySD(bilateralIntensitySD),
    separable(separable),
    QDistribution(new float[width*height*dimensions]()),
    QDistributionTmp(new float[width*height*dimensions]()),
    pottsModel(new float[dimensions*dimensions]()),
    gaussianOut(new float[width*height*dimensions]()),
    bilateralOut(new float[width*height*dimensions]()),
    aggregatedFilters(new float[width*height*dimensions]()),
    filterOutTmp(new float[width*height*dimensions]()),
    spatialKernel(new float[KERNEL_SIZE]()),
    bilateralSpatialKernel(new float[KERNEL_SIZE]()),
    bilateralIntensityKernel(new float[KERNEL_SIZE]()) {

    //Initialise potts model.
    for (int i = 0; i < dimensions; i++) {
        for (int j = 0; j < dimensions; j++) {
            pottsModel[i*dimensions + j] = (i == j) ? -1.0 : 0.0;
        }
    }

    //Initialise kernels.
    generateGaussianKernel(spatialKernel.get(), KERNEL_SIZE, spatialSD);
    generateGaussianKernel(bilateralSpatialKernel.get(), KERNEL_SIZE, bilateralSpatialSD);
    generateGaussianKernel(bilateralIntensityKernel.get(), KERNEL_SIZE, bilateralIntensitySD);
}